

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseCoDim
          (SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,SPxId *enterId)

{
  int i;
  int iVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  int *piVar4;
  type_conflict5 tVar5;
  DataKey DVar6;
  long lVar7;
  long lVar8;
  pointer pnVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  ulong uVar12;
  byte bVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  
  bVar13 = 0;
  local_138.m_backend.data._M_elems[0] = 0;
  local_138.m_backend.data._M_elems[1] = 0;
  local_138.m_backend.data._M_elems[2] = 0;
  local_138.m_backend.data._M_elems[3] = 0;
  local_138.m_backend.data._M_elems[4] = 0;
  local_138.m_backend.data._M_elems[5] = 0;
  local_138.m_backend.data._M_elems[6] = 0;
  local_138.m_backend.data._M_elems[7] = 0;
  local_138.m_backend.data._M_elems[8] = 0;
  local_138.m_backend.data._M_elems[9] = 0;
  local_138.m_backend.data._M_elems[10] = 0;
  local_138.m_backend.data._M_elems[0xb] = 0;
  local_138.m_backend.data._M_elems[0xc] = 0;
  local_138.m_backend.data._M_elems[0xd] = 0;
  local_138.m_backend.data._M_elems[0xe] = 0;
  local_138.m_backend.data._M_elems[0xf] = 0;
  local_138.m_backend.data._M_elems[0x10] = 0;
  local_138.m_backend.data._M_elems[0x11] = 0;
  local_138.m_backend.data._M_elems[0x12] = 0;
  local_138.m_backend.data._M_elems[0x13] = 0;
  local_138.m_backend.data._M_elems[0x14] = 0;
  local_138.m_backend.data._M_elems[0x15] = 0;
  local_138.m_backend.data._M_elems[0x16] = 0;
  local_138.m_backend.data._M_elems[0x17] = 0;
  local_138.m_backend.data._M_elems[0x18] = 0;
  local_138.m_backend.data._M_elems[0x19] = 0;
  local_138.m_backend.data._M_elems._104_5_ = 0;
  local_138.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  for (uVar12 = (ulong)(uint)(((this->
                               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).thesolver)->infeasibilitiesCo).super_IdxSet.num; 0 < (int)uVar12;
      uVar12 = uVar12 - 1) {
    pSVar2 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    i = (pSVar2->infeasibilitiesCo).super_IdxSet.idx[uVar12 - 1];
    pnVar3 = (pSVar2->theTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar8 = 0x1c;
    pnVar9 = pnVar3 + i;
    pnVar10 = &local_138;
    for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar10->m_backend).data._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
      pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar13 * -2 + 1) * 4);
      pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar10 + ((ulong)bVar13 * -2 + 1) * 4);
    }
    local_138.m_backend.exp = pnVar3[i].m_backend.exp;
    local_138.m_backend.neg = pnVar3[i].m_backend.neg;
    local_138.m_backend.fpclass = pnVar3[i].m_backend.fpclass;
    local_138.m_backend.prec_elem = pnVar3[i].m_backend.prec_elem;
    pnVar10 = &(this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thetolerance;
    pnVar11 = &result;
    for (; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pnVar11->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
      pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar10 + (ulong)bVar13 * -8 + 4);
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar13 * -2 + 1) * 4);
    }
    result.m_backend.exp =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.exp;
    result.m_backend.neg =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.neg;
    result.m_backend.fpclass =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.fpclass;
    result.m_backend.prec_elem =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar5 = boost::multiprecision::operator<(&local_138,&result);
    if (tVar5) {
      tVar5 = boost::multiprecision::operator<(&local_138,best);
      if (tVar5) {
        DVar6 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::id((this->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver,i);
        enterId->super_DataKey = DVar6;
        pnVar10 = &local_138;
        pnVar11 = best;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pnVar11->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
          pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar10 + ((ulong)bVar13 * -2 + 1) * 4);
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar13 * -2 + 1) * 4);
        }
        (best->m_backend).exp = local_138.m_backend.exp;
        (best->m_backend).neg = local_138.m_backend.neg;
        (best->m_backend).fpclass = local_138.m_backend.fpclass;
        (best->m_backend).prec_elem = local_138.m_backend.prec_elem;
      }
    }
    else {
      pSVar2 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      piVar4 = (pSVar2->infeasibilitiesCo).super_IdxSet.idx;
      iVar1 = (pSVar2->infeasibilitiesCo).super_IdxSet.num;
      (pSVar2->infeasibilitiesCo).super_IdxSet.num = iVar1 + -1;
      piVar4[uVar12 - 1] = piVar4[(long)iVar1 + -1];
      (pSVar2->isInfeasibleCo).data[i] = 0;
    }
  }
  return (SPxId)enterId->super_DataKey;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterSparseCoDim(R& best, SPxId& enterId)
{
   assert(this->thesolver != nullptr);

   int idx;
   R x;

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = this->thesolver->test()[idx];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            enterId = this->thesolver->id(idx);
            best = x;
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         assert(this->thesolver->isInfeasibleCo[idx] > 0);
         this->thesolver->isInfeasibleCo[idx] = 0;
      }
   }

   return enterId;
}